

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  string *in_RCX;
  string *in_RDI;
  string *in_R8;
  value_type *in_stack_ffffffffffffff08;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffff10;
  string local_b0 [48];
  string local_80 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
  *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  
  std::__cxx11::string::string(local_80,in_RCX);
  duckdb::ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            (&stack0xffffffffffffffa0,local_80);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x81da2f);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::string(local_b0,in_R8);
  ConstructMessageRecursive<std::__cxx11::string>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_b0);
  return in_RDI;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}